

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cf4b::BuildEngineTest_StatusCallbacks_Test::TestBody
          (BuildEngineTest_StatusCallbacks_Test *this)

{
  int32_t iVar1;
  SimpleRule *pSVar2;
  ValueType *value;
  char *pcVar3;
  _Head_base<0UL,_llbuild::core::Rule_*,_false> local_1c0;
  BuildEngine engine;
  uint numComplete;
  uint numScanned;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> local_168;
  CommandSignature local_150;
  _Any_data local_148;
  code *local_138;
  undefined8 uStack_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  undefined8 uStack_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c0;
  code *local_b0;
  code *local_a8;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  SimpleBuildEngineDelegate delegate;
  
  numScanned = 0;
  numComplete = 0;
  delegate.super_BuildEngineDelegate._vptr_BuildEngineDelegate =
       (_func_int **)&PTR__SimpleBuildEngineDelegate_001f26a8;
  delegate.super_ExecutionQueueDelegate.super_ProcessDelegate._vptr_ProcessDelegate =
       (ProcessDelegate)&PTR__SimpleBuildEngineDelegate_001f2728;
  delegate.cycle.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  delegate.cycle.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  delegate.cycle.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  delegate.cycle.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  delegate._33_8_ = 0;
  delegate.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  delegate.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  delegate.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  delegate.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  delegate._65_8_ = 0;
  llbuild::core::BuildEngine::BuildEngine(&engine,&delegate.super_BuildEngineDelegate);
  pSVar2 = (SimpleRule *)operator_new(0xa8);
  llbuild::core::KeyType::KeyType((KeyType *)&gtest_ar_1,"input");
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<int_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:729:20)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<int_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:729:20)>
             ::_M_manager;
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f8 = (code *)0x0;
  uStack_f0 = 0;
  local_88 = std::
             _Function_handler<void_(llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:732:7)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:732:7)>
             ::_M_manager;
  local_1c0._M_head_impl = (Rule *)0x0;
  local_a0._M_unused._M_object = &numScanned;
  local_a0._8_8_ = &numComplete;
  SimpleRule::SimpleRule
            (pSVar2,(KeyType *)&gtest_ar_1,
             (vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *)&gtest_ar,
             (ComputeFnType *)&local_e8,(ValidFnType *)&local_108,(StatusFnType *)&local_a0,
             (CommandSignature *)&local_1c0);
  local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)pSVar2;
  llbuild::core::BuildEngine::addRule
            (&engine,(unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *)
                     &local_168);
  if ((SimpleRule *)
      local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
      _M_impl.super__Vector_impl_data._M_start != (SimpleRule *)0x0) {
    (*((Rule *)&(local_168.
                 super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>
                 ._M_impl.super__Vector_impl_data._M_start)->key)->_vptr_Rule[1])();
  }
  local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector
            ((vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *)&gtest_ar);
  std::__cxx11::string::_M_dispose();
  pSVar2 = (SimpleRule *)operator_new(0xa8);
  llbuild::core::KeyType::KeyType((KeyType *)&gtest_ar_1,"output");
  llbuild::core::KeyType::KeyType((KeyType *)&gtest_ar,"input");
  local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<llbuild::core::KeyType,std::allocator<llbuild::core::KeyType>>::
  _M_range_initialize<llbuild::core::KeyType_const*>
            ((vector<llbuild::core::KeyType,std::allocator<llbuild::core::KeyType>> *)&local_168,
             &gtest_ar,&gtest_ar_1);
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<int_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:742:20)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<int_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:742:20)>
              ::_M_manager;
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  local_138 = (code *)0x0;
  uStack_130 = 0;
  local_a8 = std::
             _Function_handler<void_(llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:746:7)>
             ::_M_invoke;
  local_b0 = std::
             _Function_handler<void_(llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:746:7)>
             ::_M_manager;
  local_150.value = 0;
  local_c0._M_unused._M_object = &numScanned;
  local_c0._8_8_ = &numComplete;
  SimpleRule::SimpleRule
            (pSVar2,(KeyType *)&gtest_ar_1,&local_168,(ComputeFnType *)&local_128,
             (ValidFnType *)&local_148,(StatusFnType *)&local_c0,&local_150);
  local_1c0._M_head_impl = (Rule *)pSVar2;
  llbuild::core::BuildEngine::addRule
            (&engine,(unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *)
                     &local_1c0);
  if ((SimpleRule *)local_1c0._M_head_impl != (SimpleRule *)0x0) {
    (*((Rule *)&(local_1c0._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  local_1c0._M_head_impl = (Rule *)0x0;
  if (local_b0 != (code *)0x0) {
    (*local_b0)(&local_c0,&local_c0,__destroy_functor);
  }
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,__destroy_functor);
  }
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector(&local_168);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_168.
                         super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,6);
  llbuild::core::KeyType::KeyType((KeyType *)&gtest_ar_1,"output");
  value = llbuild::core::BuildEngine::build(&engine,(KeyType *)&gtest_ar_1);
  iVar1 = intFromValue(value);
  local_1c0._M_head_impl._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"2 * 3","intFromValue(engine.build(\"output\"))",
             (int *)&local_168,(int *)&local_1c0);
  std::__cxx11::string::_M_dispose();
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,0x2f4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_1,"2U","numScanned",(uint *)&gtest_ar,&numScanned);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,0x2f5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  gtest_ar._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_1,"2U","numComplete",(uint *)&gtest_ar,&numComplete);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,0x2f6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  llbuild::core::BuildEngine::~BuildEngine(&engine);
  SimpleBuildEngineDelegate::~SimpleBuildEngineDelegate(&delegate);
  return;
}

Assistant:

TEST(BuildEngineTest, StatusCallbacks) {
  unsigned numScanned = 0;
  unsigned numComplete = 0;
  SimpleBuildEngineDelegate delegate;
  core::BuildEngine engine(delegate);
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "input", {}, [&] (const std::vector<int>& inputs) {
          return 2; },
      nullptr,
      [&] (core::Rule::StatusKind status) {
        if (status == core::Rule::StatusKind::IsScanning) {
          ++numScanned;
        } else {
          assert(status == core::Rule::StatusKind::IsComplete);
          ++numComplete;
        }
      } )));
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "output", {"input"},
                   [&] (const std::vector<int>& inputs) {
                     return inputs[0] * 3;
                   },
      nullptr,
      [&] (core::Rule::StatusKind status) {
        if (status == core::Rule::StatusKind::IsScanning) {
          ++numScanned;
        } else {
          assert(status == core::Rule::StatusKind::IsComplete);
          ++numComplete;
        }
      } )));

  // Build the result.
  EXPECT_EQ(2 * 3, intFromValue(engine.build("output")));
  EXPECT_EQ(2U, numScanned);
  EXPECT_EQ(2U, numComplete);
}